

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  undefined1 local_a0 [8];
  CTape tape;
  undefined1 local_30 [8];
  string magicPhrase;
  
  local_30 = (undefined1  [8])&magicPhrase._M_string_length;
  magicPhrase._M_dataplus._M_p = (pointer)0x0;
  magicPhrase._M_string_length._0_1_ = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_30);
  CTape::CTape((CTape *)local_a0,0x1e);
  CTape::produce((string *)&tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (CTape *)local_a0,(string *)local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           (string *)&tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string
            ((string *)&tape.m_l2t._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CTape::~CTape((CTape *)local_a0);
  std::__cxx11::string::~string((string *)local_30);
  return 0;
}

Assistant:

int main()
{
    string magicPhrase;
    getline(cin, magicPhrase);

    CTape tape;

    cout << tape.produce(magicPhrase) << endl;

    return 0;
}